

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_wiener_filter(int wiener_win,WienerInfo *wiener_info,WienerInfo *ref_wiener_info,
                        aom_writer *wb)

{
  undefined8 *in_RDX;
  aom_writer *in_RSI;
  int in_EDI;
  
  if (in_EDI == 7) {
    aom_write_primitive_refsubexpfin
              (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
               (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  }
  aom_write_primitive_refsubexpfin
            (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
             (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  aom_write_primitive_refsubexpfin
            (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
             (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  if (in_EDI == 7) {
    aom_write_primitive_refsubexpfin
              (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
               (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  }
  aom_write_primitive_refsubexpfin
            (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
             (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  aom_write_primitive_refsubexpfin
            (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
             (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  *in_RDX = *(undefined8 *)in_RSI;
  in_RDX[1] = in_RSI->buffer;
  in_RDX[2] = (in_RSI->ec).buf;
  in_RDX[3] = *(undefined8 *)&(in_RSI->ec).storage;
  return;
}

Assistant:

static inline void write_wiener_filter(int wiener_win,
                                       const WienerInfo *wiener_info,
                                       WienerInfo *ref_wiener_info,
                                       aom_writer *wb) {
  if (wiener_win == WIENER_WIN)
    aom_write_primitive_refsubexpfin(
        wb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV);
  else
    assert(wiener_info->vfilter[0] == 0 &&
           wiener_info->vfilter[WIENER_WIN - 1] == 0);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV);
  if (wiener_win == WIENER_WIN)
    aom_write_primitive_refsubexpfin(
        wb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV);
  else
    assert(wiener_info->hfilter[0] == 0 &&
           wiener_info->hfilter[WIENER_WIN - 1] == 0);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV);
  memcpy(ref_wiener_info, wiener_info, sizeof(*wiener_info));
}